

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

Promise<void> __thiscall
capnp::_::TestPipelineImpl::getAnyCap(TestPipelineImpl *this,GetAnyCapContext context)

{
  uint32_t uVar1;
  char *__n;
  TestPipelineImpl *in_RDX;
  void *__buf;
  PromiseNode *extraout_RDX;
  int __flags;
  char *in_R8;
  Promise<void> PVar2;
  CallContextHook *local_130;
  TestPipelineImpl *local_128;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_120;
  Maybe<capnp::MessageSize> local_e8;
  Client local_d0;
  undefined1 local_b8 [8];
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request;
  undefined1 local_70 [8];
  Client cap;
  int local_58;
  bool local_51;
  undefined1 local_50 [7];
  bool _kj_shouldLog;
  Reader params;
  TestPipelineImpl *this_local;
  GetAnyCapContext context_local;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  params._reader._40_8_ = context.hook;
  this_local = in_RDX;
  context_local.hook = (CallContextHook *)this;
  CallContext<capnproto_test::capnp::test::TestPipeline::GetAnyCapParams,_capnproto_test::capnp::test::TestPipeline::GetAnyCapResults>
  ::getParams((Reader *)local_50,
              (CallContext<capnproto_test::capnp::test::TestPipeline::GetAnyCapParams,_capnproto_test::capnp::test::TestPipeline::GetAnyCapResults>
               *)&this_local);
  uVar1 = capnproto_test::capnp::test::TestPipeline::GetAnyCapParams::Reader::getN
                    ((Reader *)local_50);
  __flags = (int)in_R8;
  __n = (char *)(ulong)uVar1;
  if (uVar1 != 0xea) {
    local_51 = kj::_::Debug::shouldLog(ERROR);
    while (__flags = (int)in_R8, local_51 != false) {
      local_58 = 0xea;
      cap.hook.ptr._4_4_ =
           capnproto_test::capnp::test::TestPipeline::GetAnyCapParams::Reader::getN
                     ((Reader *)local_50);
      __n = "\"failed: expected \" \"(234) == (params.getN())\", 234, params.getN()";
      in_R8 = "failed: expected (234) == (params.getN())";
      kj::_::Debug::log<char_const(&)[42],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x3bf,ERROR,
                 "\"failed: expected \" \"(234) == (params.getN())\", 234, params.getN()",
                 (char (*) [42])"failed: expected (234) == (params.getN())",&stack0xffffffffffffffa8
                 ,(uint *)((long)&cap.hook.ptr + 4));
      local_51 = false;
    }
  }
  capnproto_test::capnp::test::TestPipeline::GetAnyCapParams::Reader::getInCap((Reader *)local_70);
  CallContext<capnproto_test::capnp::test::TestPipeline::GetAnyCapParams,_capnproto_test::capnp::test::TestPipeline::GetAnyCapResults>
  ::releaseParams((CallContext<capnproto_test::capnp::test::TestPipeline::GetAnyCapParams,_capnproto_test::capnp::test::TestPipeline::GetAnyCapResults>
                   *)&this_local);
  Capability::Client::castAs<capnproto_test::capnp::test::TestInterface>
            (&local_d0,(Client *)local_70);
  kj::Maybe<capnp::MessageSize>::Maybe(&local_e8,(void *)0x0);
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            ((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_b8,&local_d0,&local_e8);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_e8);
  capnproto_test::capnp::test::TestInterface::Client::~Client(&local_d0);
  capnproto_test::capnp::test::TestInterface::FooParams::Builder::setI((Builder *)local_b8,0x7b);
  capnproto_test::capnp::test::TestInterface::FooParams::Builder::setJ((Builder *)local_b8,true);
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send(&local_120,(int)local_b8,__buf,(size_t)__n,__flags);
  local_128 = this_local;
  local_130 = context.hook;
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>>::
  then<capnp::_::TestPipelineImpl::getAnyCap(capnp::CallContext<capnproto_test::capnp::test::TestPipeline::GetAnyCapParams,capnproto_test::capnp::test::TestPipeline::GetAnyCapResults>)::__0,kj::_::PropagateException>
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>> *)
             this,(Type *)&local_120,(PropagateException *)&local_130);
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> *)&local_120);
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::~Request((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_b8);
  Capability::Client::~Client((Client *)local_70);
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar2.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> TestPipelineImpl::getAnyCap(GetAnyCapContext context) {
  ++callCount;

  auto params = context.getParams();
  EXPECT_EQ(234, params.getN());

  auto cap = params.getInCap();
  context.releaseParams();

  auto request = cap.castAs<test::TestInterface>().fooRequest();
  request.setI(123);
  request.setJ(true);

  return request.send().then(
      [this,KJ_CPCAP(context)](Response<test::TestInterface::FooResults>&& response) mutable {
        EXPECT_EQ("foo", response.getX());

        auto result = context.getResults();
        result.setS("bar");
        result.initOutBox().setCap(kj::heap<TestExtendsImpl>(callCount));
      }